

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

RpcValue __thiscall
miniros::master::Master::getSystemState(Master *this,string *caller_id,Connection *connection)

{
  Error EVar1;
  XmlRpcValue *pXVar2;
  long in_RCX;
  RpcValue *result;
  RpcValue *result_00;
  RpcValue *result_01;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  RpcValue RVar3;
  RpcValue listoftypes;
  SystemState state;
  RequesterInfo requesterInfo;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  requesterInfo.callerId._M_dataplus._M_p._0_4_ = 1;
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&requesterInfo);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar2,"current system state");
  RequesterInfo::RequesterInfo(&requesterInfo);
  EVar1 = RequesterInfo::assign(&requesterInfo,(string *)connection,*(int *)(in_RCX + 8));
  if (EVar1.code != Ok) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (getSystemState::loc.initialized_ == false) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&state,"miniros.unknown_package",(allocator<char> *)&listoftypes);
      console::initializeLogLocation(&getSystemState::loc,(string *)&state,Warn);
      ::std::__cxx11::string::~string((string *)&state);
    }
    if (getSystemState::loc.level_ != Warn) {
      console::setLogLocationLevel(&getSystemState::loc,Warn);
      console::checkLogLocationEnabled(&getSystemState::loc);
    }
    if (getSystemState::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,getSystemState::loc.logger_,getSystemState::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,0xd8,
                     "Master::RpcValue miniros::master::Master::getSystemState(const std::string &, Connection *)"
                     ,"Failed to read network address of caller %s",
                     (connection->super_XmlRpcSource)._vptr_XmlRpcSource);
    }
  }
  MasterHandler::getSystemState(&state,(MasterHandler *)(caller_id + 0x13),&requesterInfo);
  XmlRpc::XmlRpcValue::Array(&listoftypes,3);
  pXVar2 = XmlRpc::XmlRpcValue::operator[](&listoftypes,0);
  getSystemState::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&state,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)pXVar2,result);
  pXVar2 = XmlRpc::XmlRpcValue::operator[](&listoftypes,1);
  getSystemState::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&state.subscribers,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)pXVar2,result_00);
  pXVar2 = XmlRpc::XmlRpcValue::operator[](&listoftypes,2);
  getSystemState::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&state.services,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)pXVar2,result_01);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&listoftypes);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&listoftypes);
  MasterHandler::SystemState::~SystemState(&state);
  RequesterInfo::~RequesterInfo(&requesterInfo);
  RVar3._value.asDouble = extraout_RDX.asDouble;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Master::RpcValue Master::getSystemState(const std::string& caller_id, Connection* connection)
{
  RpcValue res = RpcValue::Array(3);
  res[0] = 1;
  res[1] = "current system state";

  auto writeXml = [&](const std::map<std::string, std::vector<std::string>>& providers, RpcValue& result) {
    int index = 0;
    result.setSize(providers.size());
    for (const auto& [key, apis] : providers) {
      RpcValue xmlApis;
      xmlApis.setSize(apis.size());
      for (size_t i = 0; i < apis.size(); i++) {
        xmlApis[i] = apis[i];
      }

      RpcValue group;
      group.setSize(2);
      group[0] = key;
      group[1] = xmlApis;
      result[index++] = group;
    }
  };

  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }

  MasterHandler::SystemState state = m_handler.getSystemState(requesterInfo);

  RpcValue listoftypes = RpcValue::Array(3);

  writeXml(state.publishers, listoftypes[0]);
  writeXml(state.subscribers, listoftypes[1]);
  writeXml(state.services, listoftypes[2]);

  res[2] = listoftypes;
  return res;
}